

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINSetJacTimesVecFn(void *kinmem,KINLsJacTimesVecFn jtv)

{
  long in_RSI;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  int retval;
  KINMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  KINMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = kinLs_AccessLMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                             in_stack_ffffffffffffffc8,(KINLsMem *)0x115979);
  if (local_4 == 0) {
    if (*(long *)(*(long *)(*(long *)(in_stack_ffffffffffffffd0 + 0x20) + 8) + 0x10) == 0) {
      KINProcessError(in_stack_ffffffffffffffd8,-3,0x148,"KINSetJacTimesVecFn",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"SUNLinearSolver object does not support user-supplied ATimes routine");
      local_4 = -3;
    }
    else {
      if (in_RSI == 0) {
        in_stack_ffffffffffffffd0[0x98] = '\x01';
        in_stack_ffffffffffffffd0[0x99] = '\0';
        in_stack_ffffffffffffffd0[0x9a] = '\0';
        in_stack_ffffffffffffffd0[0x9b] = '\0';
        *(code **)(in_stack_ffffffffffffffd0 + 0xa0) = kinLsDQJtimes;
        *(KINSysFn *)(in_stack_ffffffffffffffd0 + 0xa8) = in_stack_ffffffffffffffd8->kin_func;
        *(KINMem *)(in_stack_ffffffffffffffd0 + 0xb0) = in_stack_ffffffffffffffd8;
      }
      else {
        in_stack_ffffffffffffffd0[0x98] = '\0';
        in_stack_ffffffffffffffd0[0x99] = '\0';
        in_stack_ffffffffffffffd0[0x9a] = '\0';
        in_stack_ffffffffffffffd0[0x9b] = '\0';
        *(long *)(in_stack_ffffffffffffffd0 + 0xa0) = in_RSI;
        *(void **)(in_stack_ffffffffffffffd0 + 0xb0) = in_stack_ffffffffffffffd8->kin_user_data;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int KINSetJacTimesVecFn(void* kinmem, KINLsJacTimesVecFn jtv)
{
  int retval;
  KINMem kin_mem;
  KINLsMem kinls_mem;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* issue error if LS object does not support user-supplied ATimes */
  if (kinls_mem->LS->ops->setatimes == NULL)
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "SUNLinearSolver object does not support user-supplied "
                    "ATimes routine");
    return (KINLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routine in KINLs
     interface (NULL jtimes implies use of DQ default) */
  if (jtv != NULL)
  {
    kinls_mem->jtimesDQ = SUNFALSE;
    kinls_mem->jtimes   = jtv;
    kinls_mem->jt_data  = kin_mem->kin_user_data;
  }
  else
  {
    kinls_mem->jtimesDQ = SUNTRUE;
    kinls_mem->jtimes   = kinLsDQJtimes;
    kinls_mem->jt_func  = kin_mem->kin_func;
    kinls_mem->jt_data  = kin_mem;
  }

  return (KINLS_SUCCESS);
}